

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client.c
# Opt level: O1

int ssl_write_supported_groups_ext
              (mbedtls_ssl_context *ssl,uchar *buf,uchar *end,int flags,size_t *out_len)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  mbedtls_ecp_group_id mVar4;
  char *pcVar5;
  ushort uVar6;
  undefined4 in_register_0000000c;
  uint16_t *puVar7;
  ushort *puVar8;
  long lVar9;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar10;
  
  if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
     (puVar7 = ssl->handshake->group_list, puVar7 == (uint16_t *)0x0)) {
    puVar7 = ssl->conf->group_list;
  }
  *(long *)CONCAT44(in_register_0000000c,flags) = 0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
             ,0xe6,"client hello, adding supported_groups extension");
  iVar3 = -0x6a00;
  if (5 < (ulong)((long)end - (long)buf) && buf <= end) {
    if (puVar7 == (uint16_t *)0x0) {
      iVar3 = -0x5e80;
    }
    else {
      uVar2 = *puVar7;
      if (uVar2 == 0) {
        lVar9 = 6;
      }
      else {
        puVar8 = (ushort *)(buf + 6);
        lVar9 = 6;
        do {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                     ,0xf9,"got supported group(%04x)",(ulong)uVar2);
          bVar1 = true;
          if ((ushort)(*puVar7 - 0x12) < 0xd) {
            mVar4 = mbedtls_ssl_get_ecp_group_id_from_tls_id(*puVar7);
            uVar10 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
            if (mVar4 != MBEDTLS_ECP_DP_NONE) {
              if ((ulong)((long)end - (long)puVar8) < 2 || end < puVar8) {
                bVar1 = false;
              }
              else {
                *puVar8 = *puVar7 << 8 | *puVar7 >> 8;
                lVar9 = lVar9 + 2;
                pcVar5 = mbedtls_ssl_named_group_to_str(*puVar7);
                in_stack_ffffffffffffffa8 = CONCAT44(uVar10,(uint)*puVar7);
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                           ,0x11b,"NamedGroup: %s ( %x )",pcVar5,in_stack_ffffffffffffffa8);
              }
            }
          }
          if (!bVar1) {
            return -0x6a00;
          }
          puVar8 = (ushort *)(buf + lVar9);
          uVar2 = puVar7[1];
          puVar7 = puVar7 + 1;
        } while (uVar2 != 0);
      }
      if (lVar9 == 6) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                   ,0x122,"No group available.");
        iVar3 = -0x6c00;
      }
      else {
        buf[0] = '\0';
        buf[1] = '\n';
        uVar6 = (ushort)(lVar9 - 4U);
        *(ushort *)(buf + 2) = uVar6 << 8 | uVar6 >> 8;
        uVar6 = (short)lVar9 - 6;
        *(ushort *)(buf + 4) = uVar6 * 0x100 | uVar6 >> 8;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                   ,0x12e,"Supported groups extension",buf + 4,lVar9 - 4U);
        *(long *)CONCAT44(in_register_0000000c,flags) = lVar9;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_write_supported_groups_ext(mbedtls_ssl_context *ssl,
                                          unsigned char *buf,
                                          const unsigned char *end,
                                          int flags,
                                          size_t *out_len)
{
    unsigned char *p = buf;
    unsigned char *named_group_list; /* Start of named_group_list */
    size_t named_group_list_len;     /* Length of named_group_list */
    const uint16_t *group_list = mbedtls_ssl_get_groups(ssl);

    *out_len = 0;

    MBEDTLS_SSL_DEBUG_MSG(3, ("client hello, adding supported_groups extension"));

    /* Check if we have space for header and length fields:
     * - extension_type            (2 bytes)
     * - extension_data_length     (2 bytes)
     * - named_group_list_length   (2 bytes)
     */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, 6);
    p += 6;

    named_group_list = p;

    if (group_list == NULL) {
        return MBEDTLS_ERR_SSL_BAD_CONFIG;
    }

    for (; *group_list != 0; group_list++) {
        int propose_group = 0;

        MBEDTLS_SSL_DEBUG_MSG(3, ("got supported group(%04x)", *group_list));

#if defined(MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_EPHEMERAL_ENABLED)
        if (flags & SSL_WRITE_SUPPORTED_GROUPS_EXT_TLS1_3_FLAG) {
#if defined(PSA_WANT_ALG_ECDH)
            if (mbedtls_ssl_tls13_named_group_is_ecdhe(*group_list) &&
                (mbedtls_ssl_get_ecp_group_id_from_tls_id(*group_list) !=
                 MBEDTLS_ECP_DP_NONE)) {
                propose_group = 1;
            }
#endif
#if defined(PSA_WANT_ALG_FFDH)
            if (mbedtls_ssl_tls13_named_group_is_ffdh(*group_list)) {
                propose_group = 1;
            }
#endif
        }
#endif /* MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_EPHEMERAL_ENABLED */

#if defined(MBEDTLS_SSL_TLS1_2_SOME_ECC)
        if ((flags & SSL_WRITE_SUPPORTED_GROUPS_EXT_TLS1_2_FLAG) &&
            mbedtls_ssl_tls12_named_group_is_ecdhe(*group_list) &&
            (mbedtls_ssl_get_ecp_group_id_from_tls_id(*group_list) !=
             MBEDTLS_ECP_DP_NONE)) {
            propose_group = 1;
        }
#endif /* MBEDTLS_SSL_TLS1_2_SOME_ECC */

        if (propose_group) {
            MBEDTLS_SSL_CHK_BUF_PTR(p, end, 2);
            MBEDTLS_PUT_UINT16_BE(*group_list, p, 0);
            p += 2;
            MBEDTLS_SSL_DEBUG_MSG(3, ("NamedGroup: %s ( %x )",
                                      mbedtls_ssl_named_group_to_str(*group_list),
                                      *group_list));
        }
    }

    /* Length of named_group_list */
    named_group_list_len = p - named_group_list;
    if (named_group_list_len == 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("No group available."));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    /* Write extension_type */
    MBEDTLS_PUT_UINT16_BE(MBEDTLS_TLS_EXT_SUPPORTED_GROUPS, buf, 0);
    /* Write extension_data_length */
    MBEDTLS_PUT_UINT16_BE(named_group_list_len + 2, buf, 2);
    /* Write length of named_group_list */
    MBEDTLS_PUT_UINT16_BE(named_group_list_len, buf, 4);

    MBEDTLS_SSL_DEBUG_BUF(3, "Supported groups extension",
                          buf + 4, named_group_list_len + 2);

    *out_len = p - buf;

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    mbedtls_ssl_tls13_set_hs_sent_ext_mask(
        ssl, MBEDTLS_TLS_EXT_SUPPORTED_GROUPS);
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */

    return 0;
}